

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool dg::vr::sameBase(ValueRelations *graph,V val1,V val2)

{
  Relations RVar1;
  V rt;
  bool bVar2;
  
  bVar2 = val1 != (V)0x0;
  if (bVar2) {
    do {
      rt = val2;
      if (val2 != (V)0x0) {
        do {
          RVar1 = ValueRelations::_between(graph,val1,rt);
          if (((ulong)RVar1.bits.super__Base_bitset<1UL>._M_w & 1) != 0) {
            return bVar2;
          }
          if (rt[0x10] == (Value)0x3d) {
            rt = *(V *)(rt + -(ulong)(uint)(*(int *)(rt + 0x14) << 5));
          }
          else {
            rt = (V)0x0;
          }
        } while (rt != (V)0x0);
      }
      if (val1[0x10] == (Value)0x3d) {
        val1 = *(V *)(val1 + -(ulong)(uint)(*(int *)(val1 + 0x14) << 5));
      }
      else {
        val1 = (V)0x0;
      }
      bVar2 = val1 != (V)0x0;
    } while (bVar2);
  }
  return bVar2;
}

Assistant:

bool sameBase(const ValueRelations &graph, V val1, V val2) {
    V val2orig = val2;
    while (val1) {
        val2 = val2orig;
        while (val2) {
            if (graph.are(val1, Relations::EQ,
                          val2)) // TODO compare whether indices may equal
                return true;
            val2 = getGEPBase(val2);
        }
        val1 = getGEPBase(val1);
    }
    return false;
}